

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_nbcd(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGv_i32 pTVar1;
  TCGv_i32 ea_result;
  TCGv_i32 addr;
  TCGv_i32 dest;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  DisasContext_conflict2 *pDStack_18;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  src = (TCGv_i32)s->uc->tcg_ctx;
  tcg_ctx._6_2_ = insn;
  pDStack_18 = s;
  s_local = (DisasContext_conflict2 *)env;
  gen_flush_flags(s);
  dest = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,0,
                *(TCGv_i32 *)(src + 0x94f8),&ea_result,EA_LOADU,
                (uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (dest == *(TCGv_i32 *)(src + 0x94f8)) {
    gen_addr_fault(pDStack_18);
  }
  else {
    addr = tcg_const_i32_m68k((TCGContext_conflict2 *)src,0);
    bcd_sub((TCGContext_conflict2 *)src,addr,dest);
    pTVar1 = gen_ea((CPUM68KState_conflict *)s_local,pDStack_18,tcg_ctx._6_2_,0,addr,&ea_result,
                    EA_STORE,(uint)(((((pDStack_18->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
    if (pTVar1 == *(TCGv_i32 *)(src + 0x94f8)) {
      gen_addr_fault(pDStack_18);
    }
    else {
      bcd_flags((TCGContext_conflict2 *)src,addr);
      tcg_temp_free_i32((TCGContext_conflict2 *)src,addr);
    }
  }
  return;
}

Assistant:

DISAS_INSN(nbcd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, dest;
    TCGv addr;

    gen_flush_flags(s); /* !Z is sticky */

    SRC_EA(env, src, OS_BYTE, 0, &addr);

    dest = tcg_const_i32(tcg_ctx, 0);
    bcd_sub(tcg_ctx, dest, src);

    DEST_EA(env, insn, OS_BYTE, dest, &addr);

    bcd_flags(tcg_ctx, dest);

    tcg_temp_free(tcg_ctx, dest);
}